

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O3

void Addr_EDI(OPTYPE *pMyOperand,PDISASM pMyDisasm)

{
  size_t sVar1;
  size_t i;
  
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    pMyOperand->OpMnemonic[2] = '\0';
    pMyOperand->OpMnemonic[0] = '(';
    pMyOperand->OpMnemonic[1] = '%';
    i = 2;
  }
  else {
    i = 0;
  }
  fillModrm0Register(pMyOperand,pMyDisasm,i,'\a');
  if ((pMyDisasm->Reserved_).AddressSize == 0x10) {
    (pMyOperand->Memory).BaseRegister = REGS[3];
  }
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    sVar1 = strlen(pMyOperand->OpMnemonic);
    (pMyOperand->OpMnemonic + sVar1)[0] = ')';
    (pMyOperand->OpMnemonic + sVar1)[1] = '\0';
  }
  return;
}

Assistant:

void __bea_callspec__ Addr_EDI(OPTYPE* pMyOperand, PDISASM pMyDisasm)
{
    size_t i = 0;
    #ifndef BEA_LIGHT_DISASSEMBLY
    if (GV.SYNTAX_ == ATSyntax) {
        (void) strcpy((char*) pMyOperand->OpMnemonic, "(%");
        i += 2;
    }
    #endif

  fillModrm0Register(pMyOperand, pMyDisasm, i, 7);
  if (GV.AddressSize == 16) {
    pMyOperand->Memory.BaseRegister = REGS[3];
  }
  #ifndef BEA_LIGHT_DISASSEMBLY
  i = strlen ((char*) &pMyOperand->OpMnemonic);
  if (GV.SYNTAX_ == ATSyntax) {
      (void) strcpy((char*) pMyOperand->OpMnemonic+i, ")");
      i += 1;
  }
  #endif
}